

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,VectorBase<double> *y,
          SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *ridx;
  double *rhs;
  int *ridx2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  int *piVar5;
  double *vec;
  int iVar6;
  int iVar7;
  long lVar8;
  pointer vec2;
  Real eps;
  Real RVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> *__range2;
  
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  rhs = (this->ssvec).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  (this->ssvec).setupStatus = false;
  iVar6 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  ridx2 = (rhs2->super_IdxSet).idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  eps = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  vec2 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  pdVar4 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (vec2 != pdVar4) {
    memset(vec2,0,(long)pdVar4 - (long)vec2 & 0xfffffffffffffff8);
  }
  iVar7 = rhs1->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if ((long)iVar7 < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    do {
      iVar2 = *(int *)((long)&rhs1->m_elem->idx + lVar8);
      dVar1 = *(double *)((long)&rhs1->m_elem->val + lVar8);
      RVar9 = Tolerances::epsilon((this->ssvec)._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar10 = 0.0;
      if (RVar9 < ABS(dVar1)) {
        piVar5 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar5[iVar3] = iVar2;
        dVar10 = dVar1;
      }
      pdVar4[iVar2] = dVar10;
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar7 * 0x10 != lVar8);
    iVar7 = (this->ssvec).super_IdxSet.num;
    vec2 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  }
  (this->ssvec).setupStatus = true;
  piVar5 = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  x->setupStatus = false;
  rhs2->setupStatus = false;
  iVar6 = CLUFactor<double>::vSolveLeft2
                    (&this->super_CLUFactor<double>,eps,vec,piVar5,rhs,ridx,iVar7,vec2,
                     (rhs2->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,ridx2,iVar6);
  x->setupStatus = false;
  (x->super_IdxSet).num = iVar6;
  if (0 < iVar6) {
    x->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2) //const
{

   solveTime->start();

   int   n;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   int   rn   = rhs2.size();
   int*  ridx = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   ssvec.assign(rhs1);
   n = ssvec.size(); // see altValues();
   n = this->vSolveLeft2(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n,
                         y.get_ptr(), rhs2.altValues(), ridx, rn);

   // this will unsetup x
   x.setSize(n);

   if(n > 0)
      x.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}